

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

void qt_from_latin1(char16_t *dst,char *str,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  size_t sVar22;
  long lVar23;
  char *pcVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  if (size < 0x10) {
    if (size != 0) {
      sVar22 = 0;
      do {
        dst[sVar22] = (ushort)(byte)str[sVar22];
        sVar22 = sVar22 + 1;
      } while (size != sVar22);
    }
  }
  else {
    if ((long)size < 0x10) {
      lVar23 = 0;
    }
    else {
      pcVar24 = str + 0x10;
      lVar23 = 0;
      do {
        auVar1 = *(undefined1 (*) [16])(pcVar24 + -0x10);
        auVar2[0xd] = 0;
        auVar2._0_13_ = auVar1._0_13_;
        auVar2[0xe] = auVar1[7];
        auVar4[0xc] = auVar1[6];
        auVar4._0_12_ = auVar1._0_12_;
        auVar4._13_2_ = auVar2._13_2_;
        auVar6[0xb] = 0;
        auVar6._0_11_ = auVar1._0_11_;
        auVar6._12_3_ = auVar4._12_3_;
        auVar8[10] = auVar1[5];
        auVar8._0_10_ = auVar1._0_10_;
        auVar8._11_4_ = auVar6._11_4_;
        auVar10[9] = 0;
        auVar10._0_9_ = auVar1._0_9_;
        auVar10._10_5_ = auVar8._10_5_;
        auVar12[8] = auVar1[4];
        auVar12._0_8_ = auVar1._0_8_;
        auVar12._9_6_ = auVar10._9_6_;
        auVar16._7_8_ = 0;
        auVar16._0_7_ = auVar12._8_7_;
        auVar18._1_8_ = SUB158(auVar16 << 0x40,7);
        auVar18[0] = auVar1[3];
        auVar18._9_6_ = 0;
        auVar19._1_10_ = SUB1510(auVar18 << 0x30,5);
        auVar19[0] = auVar1[2];
        auVar19._11_4_ = 0;
        auVar14[2] = auVar1[1];
        auVar14._0_2_ = auVar1._0_2_;
        auVar14._3_12_ = SUB1512(auVar19 << 0x20,3);
        auVar27._0_2_ = auVar1._0_2_ & 0xff;
        auVar27._2_13_ = auVar14._2_13_;
        auVar27[0xf] = 0;
        *(undefined1 (*) [16])(dst + lVar23) = auVar27;
        auVar26[1] = 0;
        auVar26[0] = auVar1[8];
        auVar26[2] = auVar1[9];
        auVar26[3] = 0;
        auVar26[4] = auVar1[10];
        auVar26[5] = 0;
        auVar26[6] = auVar1[0xb];
        auVar26[7] = 0;
        auVar26[8] = auVar1[0xc];
        auVar26[9] = 0;
        auVar26[10] = auVar1[0xd];
        auVar26[0xb] = 0;
        auVar26[0xc] = auVar1[0xe];
        auVar26[0xd] = 0;
        auVar26[0xe] = auVar1[0xf];
        auVar26[0xf] = 0;
        *(undefined1 (*) [16])(dst + lVar23 + 8) = auVar26;
        lVar23 = lVar23 + 0x10;
        pcVar24 = pcVar24 + 0x10;
      } while (pcVar24 <= str + size);
    }
    if (lVar23 < (long)size) {
      auVar1 = *(undefined1 (*) [16])(str + (size - 0x10));
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar1._0_13_;
      auVar3[0xe] = auVar1[7];
      auVar5[0xc] = auVar1[6];
      auVar5._0_12_ = auVar1._0_12_;
      auVar5._13_2_ = auVar3._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar1._0_11_;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9[10] = auVar1[5];
      auVar9._0_10_ = auVar1._0_10_;
      auVar9._11_4_ = auVar7._11_4_;
      auVar11[9] = 0;
      auVar11._0_9_ = auVar1._0_9_;
      auVar11._10_5_ = auVar9._10_5_;
      auVar13[8] = auVar1[4];
      auVar13._0_8_ = auVar1._0_8_;
      auVar13._9_6_ = auVar11._9_6_;
      auVar17._7_8_ = 0;
      auVar17._0_7_ = auVar13._8_7_;
      auVar20._1_8_ = SUB158(auVar17 << 0x40,7);
      auVar20[0] = auVar1[3];
      auVar20._9_6_ = 0;
      auVar21._1_10_ = SUB1510(auVar20 << 0x30,5);
      auVar21[0] = auVar1[2];
      auVar21._11_4_ = 0;
      auVar15[2] = auVar1[1];
      auVar15._0_2_ = auVar1._0_2_;
      auVar15._3_12_ = SUB1512(auVar21 << 0x20,3);
      auVar28._0_2_ = auVar1._0_2_ & 0xff;
      auVar28._2_13_ = auVar15._2_13_;
      auVar28[0xf] = 0;
      *(undefined1 (*) [16])(dst + (size - 0x10)) = auVar28;
      auVar25[1] = 0;
      auVar25[0] = auVar1[8];
      auVar25[2] = auVar1[9];
      auVar25[3] = 0;
      auVar25[4] = auVar1[10];
      auVar25[5] = 0;
      auVar25[6] = auVar1[0xb];
      auVar25[7] = 0;
      auVar25[8] = auVar1[0xc];
      auVar25[9] = 0;
      auVar25[10] = auVar1[0xd];
      auVar25[0xb] = 0;
      auVar25[0xc] = auVar1[0xe];
      auVar25[0xd] = 0;
      auVar25[0xe] = auVar1[0xf];
      auVar25[0xf] = 0;
      *(undefined1 (*) [16])(dst + (size - 8)) = auVar25;
      return;
    }
  }
  return;
}

Assistant:

Q_CORE_EXPORT void qt_from_latin1(char16_t *dst, const char *str, size_t size) noexcept
{
    /* SIMD:
     * Unpacking with SSE has been shown to improve performance on recent CPUs
     * The same method gives no improvement with NEON. On Aarch64, clang will do the vectorization
     * itself in exactly the same way as one would do it with intrinsics.
     */
#if defined(__SSE2__)
    // we're going to read str[offset..offset+15] (16 bytes)
    const __m128i nullMask = _mm_setzero_si128();
    auto processOneChunk = [=](qptrdiff offset) {
        const __m128i chunk = _mm_loadu_si128((const __m128i*)(str + offset)); // load
        if constexpr (UseAvx2) {
            // zero extend to an YMM register
            const __m256i extended = _mm256_cvtepu8_epi16(chunk);

            // store
            _mm256_storeu_si256((__m256i*)(dst + offset), extended);
        } else {
            // unpack the first 8 bytes, padding with zeros
            const __m128i firstHalf = _mm_unpacklo_epi8(chunk, nullMask);
            _mm_storeu_si128((__m128i*)(dst + offset), firstHalf); // store

            // unpack the last 8 bytes, padding with zeros
            const __m128i secondHalf = _mm_unpackhi_epi8 (chunk, nullMask);
            _mm_storeu_si128((__m128i*)(dst + offset + 8), secondHalf); // store
        }
    };

    const char *e = str + size;
    if (size >= sizeof(__m128i)) {
        qptrdiff offset = 0;
        for ( ; str + offset + sizeof(__m128i) <= e; offset += sizeof(__m128i))
            processOneChunk(offset);
        if (str + offset < e)
            processOneChunk(size - sizeof(__m128i));
        return;
    }

#  if !defined(__OPTIMIZE_SIZE__)
    if (size >= 4) {
        // two overlapped loads & stores, of either 64-bit or of 32-bit
        if (size >= 8) {
            const __m128i unpacked1 = mm_load8_zero_extend(str);
            const __m128i unpacked2 = mm_load8_zero_extend(str + size - 8);
            _mm_storeu_si128(reinterpret_cast<__m128i *>(dst), unpacked1);
            _mm_storeu_si128(reinterpret_cast<__m128i *>(dst + size -  8), unpacked2);
        } else {
            const __m128i chunk1 = _mm_cvtsi32_si128(qFromUnaligned<quint32>(str));
            const __m128i chunk2 = _mm_cvtsi32_si128(qFromUnaligned<quint32>(str + size - 4));
            const __m128i unpacked1 = _mm_unpacklo_epi8(chunk1, nullMask);
            const __m128i unpacked2 = _mm_unpacklo_epi8(chunk2, nullMask);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(dst), unpacked1);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(dst + size - 4), unpacked2);
        }
        return;
    } else {
        size = size % 4;
        return UnrollTailLoop<3>::exec(qsizetype(size), [=](qsizetype i) { dst[i] = uchar(str[i]); });
    }
#  endif
#endif
#if defined(__mips_dsp)
    static_assert(sizeof(qsizetype) == sizeof(int),
                  "oops, the assembler implementation needs to be called in a loop");
    if (size > 20)
        qt_fromlatin1_mips_asm_unroll8(dst, str, size);
    else
        qt_fromlatin1_mips_asm_unroll4(dst, str, size);
#else
    while (size--)
        *dst++ = (uchar)*str++;
#endif
}